

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall vector<Edge>::vector(vector<Edge> *this,vector<Edge> *other)

{
  vector<Edge> *other_local;
  vector<Edge> *this_local;
  
  operator=(this,other);
  return;
}

Assistant:

vector(const vector &other) {
        *this = other;
//        _size = other._size;
//        _capacity = other._capacity;
//        vect = new T[_capacity];
//
//        for (int i = 0; i < _size; ++i) {
//            vect[i] = other[i];
//        }
    }